

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGuiStb::STB_TEXTEDIT_GETWIDTH(ImGuiInputTextState *obj,int line_start_idx,int char_idx)

{
  unsigned_short *puVar1;
  int in_EDX;
  int in_ESI;
  ImFont *in_RDI;
  ImWchar c;
  float local_4;
  
  puVar1 = ImVector<unsigned_short>::operator[]
                     ((ImVector<unsigned_short> *)&in_RDI->DisplayOffset,in_ESI + in_EDX);
  if (*puVar1 == 10) {
    local_4 = -1.0;
  }
  else {
    local_4 = ImFont::GetCharAdvance(in_RDI,(ImWchar)((uint)in_ESI >> 0x10));
    local_4 = local_4 * (GImGui->FontSize / GImGui->Font->FontSize);
  }
  return local_4;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->TextW[line_start_idx+char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; return GImGui->Font->GetCharAdvance(c) * (GImGui->FontSize / GImGui->Font->FontSize); }